

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O0

void __thiscall HawkTracer::parser::Event::Value::Value(Value *this,Value *other)

{
  Value *other_local;
  Value *this_local;
  
  Value(this);
  _swap(this,other);
  return;
}

Assistant:

Event::Value::Value(Value&& other) :
    Value()
{
    _swap(other);
}